

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O1

bool anon_unknown.dwarf_22493e::checkPixels<unsigned_int>
               (Array2D<unsigned_int> *ph,int lx,int rx,int ly,int ry,int width)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  uint *puVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  bool local_8b;
  
  local_8b = ry < ly;
  if (ly <= ry) {
    lVar3 = (long)lx;
    lVar10 = (long)ly * 4;
    iVar11 = lx + ly * width + 1;
    lVar9 = (long)ly;
    do {
      if (lx <= rx) {
        uVar12 = ((int)lVar9 * width + lx) % 0x801;
        iVar8 = lx;
        bVar2 = rx < lx;
        if (ph->_data[ph->_sizeY * lVar9 + lVar3] == uVar12) {
          lVar7 = 0;
          puVar4 = (uint *)((long)ph->_data + ph->_sizeY * lVar10 + lVar3 * 4 + 4);
          iVar8 = iVar11;
          do {
            if (lx - rx == (int)lVar7) goto LAB_001889ac;
            uVar12 = iVar8 % 0x801;
            lVar7 = lVar7 + -1;
            iVar8 = iVar8 + 1;
            uVar1 = *puVar4;
            puVar4 = puVar4 + 1;
          } while (uVar1 == uVar12);
          bVar2 = (long)rx <= (lVar3 + -1) - lVar7;
          iVar8 = lx - (int)lVar7;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", should be ",0xc);
        plVar6 = (long *)std::ostream::operator<<(poVar5,uVar12);
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        std::ostream::flush();
        if (!bVar2) {
          return local_8b;
        }
      }
LAB_001889ac:
      lVar7 = lVar9 + 1;
      local_8b = ry <= lVar9;
      lVar10 = lVar10 + 4;
      iVar11 = iVar11 + width;
      lVar9 = lVar7;
    } while (ry + 1 != (int)lVar7);
  }
  return local_8b;
}

Assistant:

bool
checkPixels (Array2D<T>& ph, int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
        for (int x = lx; x <= rx; ++x)
            if (ph[y][x] != static_cast<T> (((y * width + x) % 2049)))
            {
                cout << "value at " << x << ", " << y << ": " << ph[y][x]
                     << ", should be " << (y * width + x) % 2049 << endl
                     << flush;
                return false;
            }
    return true;
}